

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotText(char *text,double x,double y,bool vertical,ImVec2 *pixel_offset)

{
  ImU32 col;
  ImDrawList *this;
  ImVec2 IVar1;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImPlotPoint local_b0;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 pos_1;
  ImVec2 local_80;
  ImPlotPoint local_78;
  ImVec2 local_64;
  ImVec2 local_5c;
  ImVec2 local_54;
  ImVec2 pos;
  float local_44;
  float fStack_40;
  ImVec2 ctr;
  ImU32 colTxt;
  ImDrawList *DrawList;
  ImVec2 *pixel_offset_local;
  bool vertical_local;
  double y_local;
  double x_local;
  char *text_local;
  
  if (GImPlot->CurrentPlot == (ImPlotPlot *)0x0) {
    __assert_fail("(GImPlot->CurrentPlot != __null) && \"PlotText() needs to be called between BeginPlot() and EndPlot()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot_items.cpp"
                  ,0x8b9,"void ImPlot::PlotText(const char *, double, double, bool, const ImVec2 &)"
                 );
  }
  this = GetPlotDrawList();
  PushPlotClipRect(0.0);
  col = GetStyleColorU32(0xc);
  if (vertical) {
    pos = CalcTextSizeVertical(text);
    IVar1 = ::operator*(&pos,0.5);
    ImPlotPoint::ImPlotPoint(&local_78,x,y);
    local_64 = PlotToPixels(&local_78,-1);
    local_44 = IVar1.x;
    fStack_40 = IVar1.y;
    ImVec2::ImVec2(&local_80,-local_44,fStack_40);
    local_5c = ::operator+(&local_64,&local_80);
    pos_1 = ::operator+(&local_5c,pixel_offset);
    local_54 = pos_1;
    AddTextVertical(this,pos_1,col,text,(char *)0x0);
  }
  else {
    ImPlotPoint::ImPlotPoint(&local_b0,x,y);
    local_a0 = PlotToPixels(&local_b0,-1);
    local_c0 = ImGui::CalcTextSize(text,(char *)0x0,false,-1.0);
    local_b8 = ::operator*(&local_c0,0.5);
    local_98 = operator-(&local_a0,&local_b8);
    local_90 = ::operator+(&local_98,pixel_offset);
    ImDrawList::AddText(this,&local_90,col,text,(char *)0x0);
  }
  PopPlotClipRect();
  return;
}

Assistant:

void PlotText(const char* text, double x, double y, bool vertical, const ImVec2& pixel_offset) {
    IM_ASSERT_USER_ERROR(GImPlot->CurrentPlot != NULL, "PlotText() needs to be called between BeginPlot() and EndPlot()!");
    ImDrawList & DrawList = *GetPlotDrawList();
    PushPlotClipRect();
    ImU32 colTxt = GetStyleColorU32(ImPlotCol_InlayText);
    if (vertical) {
        ImVec2 ctr = CalcTextSizeVertical(text) * 0.5f;
        ImVec2 pos = PlotToPixels(ImPlotPoint(x,y)) + ImVec2(-ctr.x, ctr.y) + pixel_offset;
        AddTextVertical(&DrawList, pos, colTxt, text);
    }
    else {
        ImVec2 pos = PlotToPixels(ImPlotPoint(x,y)) - ImGui::CalcTextSize(text) * 0.5f + pixel_offset;
        DrawList.AddText(pos, colTxt, text);
    }
    PopPlotClipRect();
}